

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_realloc_array(JSContext *ctx,void **parray,int elem_size,int *psize,int req_size)

{
  int iVar1;
  void *pvVar2;
  int *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  void *in_RDI;
  int in_R8D;
  void *new_array;
  size_t slack;
  int new_size;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = max_int(in_R8D,(*in_RCX * 3) / 2);
  pvVar2 = js_realloc2((JSContext *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(size_t)in_RSI,(size_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (pvVar2 == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    *in_RCX = iVar1 + (int)(local_38 / (ulong)(long)in_EDX);
    *in_RSI = pvVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static no_inline int js_realloc_array(JSContext *ctx, void **parray,
                                      int elem_size, int *psize, int req_size)
{
    int new_size;
    size_t slack;
    void *new_array;
    /* XXX: potential arithmetic overflow */
    new_size = max_int(req_size, *psize * 3 / 2);
    new_array = js_realloc2(ctx, *parray, new_size * elem_size, &slack);
    if (!new_array)
        return -1;
    new_size += slack / elem_size;
    *psize = new_size;
    *parray = new_array;
    return 0;
}